

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintComment(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint_00;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  pprint_00 = &doc->pprint;
  SetWrap(doc,indent);
  AddString(pprint_00,"<!--");
  PPrintText(doc,2,0,node);
  AddString(pprint_00,"--");
  AddChar(pprint_00,0x3e);
  if ((node->linebreak != no) && (node->next != (Node *)0x0)) {
    prvTidyPFlushLineSmart(doc,indent);
  }
  return;
}

Assistant:

static void PPrintComment( TidyDocImpl* doc, uint indent, Node* node )
{
    TidyPrintImpl* pprint = &doc->pprint;

    SetWrap( doc, indent );
    AddString( pprint, "<!--" );

    PPrintText(doc, COMMENT, 0, node);

    AddString(pprint, "--");
    AddChar( pprint, '>' );
    if ( node->linebreak && node->next )
        TY_(PFlushLineSmart)( doc, indent );
}